

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::concat<kj::CappedArray<char,24ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_24UL> *params)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  Branch *pBVar3;
  char *pcVar4;
  String local_28;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  sVar1 = this->size_;
  __return_storage_ptr__->size_ = sVar1;
  heapString(&local_28,sVar1);
  pcVar4 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar1 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar2 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar4,1,sVar1,sVar1,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_28.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_28.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_28.content.disposer;
  local_28.content.ptr =
       (char *)kj::_::HeapArrayDisposer::allocateImpl
                         (0x40,0,0,kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::
                                   construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_28.content.size_ = 0;
  local_28.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pBVar3 = (__return_storage_ptr__->branches).ptr;
  if (pBVar3 != (Branch *)0x0) {
    sVar1 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar2 = (__return_storage_ptr__->branches).disposer;
    (**pAVar2->_vptr_ArrayDisposer)
              (pAVar2,pBVar3,0x40,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_28.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_28.content.size_;
  (__return_storage_ptr__->branches).disposer = local_28.content.disposer;
  if (this->size_ != 0) {
    pcVar4 = (char *)(__return_storage_ptr__->text).content.size_;
    if (pcVar4 != (char *)0x0) {
      pcVar4 = (__return_storage_ptr__->text).content.ptr;
    }
    memcpy(pcVar4,&this->text,this->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}